

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
fmt::v6::internal::basic_writer<fmt::v6::buffer_range<wchar_t>_>::
int_writer<wchar_t,_fmt::v6::basic_format_specs<wchar_t>_>::on_hex
          (int_writer<wchar_t,_fmt::v6::basic_format_specs<wchar_t>_> *this)

{
  char cVar1;
  uint uVar2;
  hex_writer f;
  int iVar3;
  int_writer<wchar_t,_fmt::v6::basic_format_specs<wchar_t>_> *in_RDI;
  string_view sVar4;
  undefined8 unaff_retaddr;
  undefined1 in_stack_00000008 [16];
  format_specs in_stack_00000020;
  int num_digits;
  undefined4 in_stack_fffffffffffffff0;
  
  if ((char)in_RDI->specs->field_0x9 < '\0') {
    uVar2 = in_RDI->prefix_size;
    in_RDI->prefix_size = uVar2 + 1;
    in_RDI->prefix[uVar2] = '0';
    cVar1 = in_RDI->specs->type;
    uVar2 = in_RDI->prefix_size;
    in_RDI->prefix_size = uVar2 + 1;
    in_RDI->prefix[uVar2] = cVar1;
  }
  iVar3 = count_digits<4u,unsigned_int>(in_RDI->abs_value);
  sVar4 = get_prefix((int_writer<wchar_t,_fmt::v6::basic_format_specs<wchar_t>_> *)0x1d3a14);
  f._8_8_ = unaff_retaddr;
  f.self = in_RDI;
  basic_writer<fmt::v6::buffer_range<wchar_t>>::
  write_int<fmt::v6::internal::basic_writer<fmt::v6::buffer_range<wchar_t>>::int_writer<wchar_t,fmt::v6::basic_format_specs<wchar_t>>::hex_writer>
            ((basic_writer<fmt::v6::buffer_range<wchar_t>_> *)
             CONCAT44(iVar3,in_stack_fffffffffffffff0),sVar4.size_._4_4_,
             (string_view)in_stack_00000008,in_stack_00000020,f);
  return;
}

Assistant:

void on_hex() {
      if (specs.alt) {
        prefix[prefix_size++] = '0';
        prefix[prefix_size++] = specs.type;
      }
      int num_digits = count_digits<4>(abs_value);
      writer.write_int(num_digits, get_prefix(), specs,
                       hex_writer{*this, num_digits});
    }